

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeStorage(ImGuiStorage *storage,char *label)

{
  uint uVar1;
  ImGuiStoragePair *pIVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  uVar1 = (storage->Data).Size;
  bVar3 = TreeNode(label,"%s: %d entries, %d bytes",label,(ulong)uVar1,(ulong)(uVar1 << 4));
  if (bVar3) {
    if (0 < (storage->Data).Size) {
      lVar5 = 8;
      lVar4 = 0;
      do {
        pIVar2 = (storage->Data).Data;
        BulletText("Key 0x%08X Value { i: %d }",(ulong)*(uint *)((long)pIVar2 + lVar5 + -8),
                   (ulong)*(uint *)((long)&pIVar2->key + lVar5));
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar4 < (storage->Data).Size);
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeStorage(ImGuiStorage* storage, const char* label)
{
    if (!TreeNode(label, "%s: %d entries, %d bytes", label, storage->Data.Size, storage->Data.size_in_bytes()))
        return;
    for (int n = 0; n < storage->Data.Size; n++)
    {
        const ImGuiStorage::ImGuiStoragePair& p = storage->Data[n];
        BulletText("Key 0x%08X Value { i: %d }", p.key, p.val_i); // Important: we currently don't store a type, real value may not be integer.
    }
    TreePop();
}